

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::load_block_8_8_grey(jpeg_encoder *this,int x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(x << 3);
  lVar3 = 0x33;
  do {
    lVar1 = *(long *)(this->m_comp_h_samp + lVar3);
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -0x15) = *(byte *)(lVar1 + lVar2) - 0x80;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -0x11) = *(byte *)(lVar1 + 1 + lVar2) - 0x80;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -0xd) = *(byte *)(lVar1 + 2 + lVar2) - 0x80;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -9) = *(byte *)(lVar1 + 3 + lVar2) - 0x80;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -5) = *(byte *)(lVar1 + 4 + lVar2) - 0x80;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -1) = *(byte *)(lVar1 + 5 + lVar2) - 0x80;
    *(uint *)(this->m_comp_v_samp + lVar3 * 4) = *(byte *)(lVar1 + 6 + lVar2) - 0x80;
    *(uint *)(this->m_comp_v_samp + lVar3 * 4 + 4) = *(byte *)(lVar1 + 7 + lVar2) - 0x80;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x73);
  return;
}

Assistant:

void jpeg_encoder::load_block_8_8_grey(int x) {
  uint8* pSrc;
  sample_array_t* pDst = m_sample_array;
  x <<= 3;
  for (int i = 0; i < 8; i++, pDst += 8) {
    pSrc = m_mcu_lines[i] + x;
    pDst[0] = pSrc[0] - 128;
    pDst[1] = pSrc[1] - 128;
    pDst[2] = pSrc[2] - 128;
    pDst[3] = pSrc[3] - 128;
    pDst[4] = pSrc[4] - 128;
    pDst[5] = pSrc[5] - 128;
    pDst[6] = pSrc[6] - 128;
    pDst[7] = pSrc[7] - 128;
  }
}